

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void slang::ast::RandSeqProductionSymbol::createRuleVariables
               (RsRuleSyntax *syntax,Scope *scope,
               SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  bool bVar1;
  undefined1 uVar2;
  reference ppRVar3;
  ConstantRange dim;
  reference ppVar4;
  Type *elementType;
  Scope *in_RSI;
  long in_RDI;
  Token TVar5;
  ConstantRange range;
  VariableSymbol *var;
  type_conflict2 *count;
  type *symbol;
  iterator __end2_1;
  iterator __begin2_1;
  SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
  *__range2_1;
  Compilation *comp;
  RsCaseItemSyntax *item;
  iterator __end4;
  iterator __begin4;
  SyntaxList<slang::syntax::RsCaseItemSyntax> *__range4;
  RsIfElseSyntax *ries;
  RsProdSyntax *p;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::RsProdSyntax> *__range2;
  anon_class_16_2_7e13625a countProd;
  SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
  prodMap;
  Type *in_stack_fffffffffffffd18;
  ValueSymbol *in_stack_fffffffffffffd20;
  span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> *in_stack_fffffffffffffd28;
  SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
  *in_stack_fffffffffffffd30;
  Type *in_stack_fffffffffffffd38;
  VariableSymbol *in_stack_fffffffffffffd40;
  Scope *in_stack_fffffffffffffd48;
  Type *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffda0;
  DeferredSourceRange in_stack_fffffffffffffdc0;
  Type *local_1e8;
  ValueSymbol *pVStack_1e0;
  ConstantRange local_1c8;
  bitmask<slang::ast::VariableFlags> local_1be;
  undefined4 local_1bc;
  Type *local_1b8;
  Info *local_1b0;
  SourceLocation local_1a8;
  VariableSymbol *local_1a0;
  type_conflict2 *local_198;
  type *local_190;
  RandSeqProductionSymbol *local_188;
  undefined8 uStack_180;
  iterator local_170;
  iterator local_160;
  undefined1 *local_150;
  ConstantRange local_148;
  RsProdSyntax *local_108;
  RsProdSyntax **local_100;
  __normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
  local_f8;
  long local_f0;
  Scope *local_e8;
  undefined1 *local_e0;
  undefined1 local_d8 [200];
  Scope *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
  ::SmallMap(in_stack_fffffffffffffd30);
  local_e8 = local_10;
  local_e0 = local_d8;
  local_f0 = local_8 + 0x20;
  local_f8._M_current =
       (RsProdSyntax **)
       std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffffd18);
  local_100 = (RsProdSyntax **)
              std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>::end
                        (in_stack_fffffffffffffd28);
  bVar1 = __gnu_cxx::
          operator==<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                    ((__normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                      *)in_stack_fffffffffffffd20,
                     (__normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                      *)in_stack_fffffffffffffd18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    dim = (ConstantRange)Scope::getCompilation(local_10);
    local_150 = local_d8;
    local_148 = dim;
    local_160 = boost::unordered::
                unordered_flat_map<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_slang::hash<const_slang::ast::RandSeqProductionSymbol_*,_void>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
                ::begin((unordered_flat_map<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_slang::hash<const_slang::ast::RandSeqProductionSymbol_*,_void>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
                         *)0x91698d);
    local_170 = boost::unordered::
                unordered_flat_map<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_slang::hash<const_slang::ast::RandSeqProductionSymbol_*,_void>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
                ::end((unordered_flat_map<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_slang::hash<const_slang::ast::RandSeqProductionSymbol_*,_void>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
                       *)0x9169b1);
    while( true ) {
      uVar2 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffffd20,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffffd18);
      if (!(bool)uVar2) break;
      ppVar4 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
               ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)0x9169fc);
      local_188 = ppVar4->first;
      uStack_180 = *(undefined8 *)&ppVar4->second;
      local_190 = std::get<0ul,slang::ast::RandSeqProductionSymbol_const*const,unsigned_int>
                            ((pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int> *
                             )0x916a19);
      local_198 = std::get<1ul,slang::ast::RandSeqProductionSymbol_const*const,unsigned_int>
                            ((pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int> *
                             )0x916a2b);
      TVar5 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffd50);
      local_1b0 = TVar5.info;
      elementType = TVar5._0_8_;
      local_1b8 = elementType;
      local_1a8 = parsing::Token::location((Token *)&local_1b8);
      local_1bc = 0;
      local_1a0 = BumpAllocator::
                  emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation,slang::ast::VariableLifetime>
                            ((BumpAllocator *)in_stack_fffffffffffffd50,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffffd48,(SourceLocation *)in_stack_fffffffffffffd40,
                             (VariableLifetime *)in_stack_fffffffffffffd38);
      local_1be = ast::operator|((VariableFlags)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                                 (VariableFlags)((ulong)in_stack_fffffffffffffd20 >> 0x10));
      bitmask<slang::ast::VariableFlags>::operator|=(&local_1a0->flags,&local_1be);
      if (*local_198 == 1) {
        getReturnType((RandSeqProductionSymbol *)0x916b49);
        ValueSymbol::setType(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      }
      else {
        ConstantRange::ConstantRange(&local_1c8,1,*local_198);
        in_stack_fffffffffffffd40 = local_1a0;
        in_stack_fffffffffffffd48 = local_10;
        in_stack_fffffffffffffd50 = getReturnType((RandSeqProductionSymbol *)0x916bae);
        slang::syntax::DeferredSourceRange::DeferredSourceRange
                  ((DeferredSourceRange *)in_stack_fffffffffffffd20,
                   (SyntaxNode *)in_stack_fffffffffffffd18);
        in_stack_fffffffffffffd18 = local_1e8;
        in_stack_fffffffffffffd20 = pVStack_1e0;
        in_stack_fffffffffffffd38 =
             FixedSizeUnpackedArrayType::fromDim
                       ((Scope *)CONCAT17(uVar2,in_stack_fffffffffffffda0),elementType,dim,
                        in_stack_fffffffffffffdc0);
        ValueSymbol::setType(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      }
      SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffd20,
                 (Symbol **)in_stack_fffffffffffffd18);
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    *)in_stack_fffffffffffffd20);
    }
    SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
    ::~SmallMap((SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
                 *)0x916c6f);
    return;
  }
  ppRVar3 = __gnu_cxx::
            __normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
            ::operator*(&local_f8);
  local_108 = *ppRVar3;
  (*(code *)(&DAT_00acbef4 +
            *(int *)(&DAT_00acbef4 + (ulong)((local_108->super_SyntaxNode).kind - RsCase) * 4)))();
  return;
}

Assistant:

void RandSeqProductionSymbol::createRuleVariables(const RsRuleSyntax& syntax, const Scope& scope,
                                                  SmallVectorBase<const Symbol*>& results) {
    SmallMap<const RandSeqProductionSymbol*, uint32_t, 8> prodMap;
    auto countProd = [&](const RsProdItemSyntax& item) {
        auto symbol = Lookup::unqualified(scope, item.name.valueText(),
                                          LookupFlags::AllowDeclaredAfter);
        if (symbol && symbol->kind == SymbolKind::RandSeqProduction) {
            auto& prod = symbol->as<RandSeqProductionSymbol>();
            auto& type = prod.getReturnType();
            if (!type.isVoid()) {
                auto [it, inserted] = prodMap.emplace(&prod, 1);
                if (!inserted)
                    it->second++;
            }
        }
    };

    for (auto p : syntax.prods) {
        switch (p->kind) {
            case SyntaxKind::RsProdItem:
                countProd(p->as<RsProdItemSyntax>());
                break;
            case SyntaxKind::RsCodeBlock:
                break;
            case SyntaxKind::RsIfElse: {
                auto& ries = p->as<RsIfElseSyntax>();
                countProd(*ries.ifItem);
                if (ries.elseClause)
                    countProd(*ries.elseClause->item);
                break;
            }
            case SyntaxKind::RsRepeat:
                countProd(*p->as<RsRepeatSyntax>().item);
                break;
            case SyntaxKind::RsCase:
                for (auto item : p->as<RsCaseSyntax>().items) {
                    switch (item->kind) {
                        case SyntaxKind::StandardRsCaseItem:
                            countProd(*item->as<StandardRsCaseItemSyntax>().item);
                            break;
                        case SyntaxKind::DefaultRsCaseItem:
                            countProd(*item->as<DefaultRsCaseItemSyntax>().item);
                            break;
                        default:
                            SLANG_UNREACHABLE;
                    }
                }
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    auto& comp = scope.getCompilation();
    for (auto [symbol, count] : prodMap) {
        auto var = comp.emplace<VariableSymbol>(symbol->name, syntax.getFirstToken().location(),
                                                VariableLifetime::Automatic);
        var->flags |= VariableFlags::Const | VariableFlags::CompilerGenerated;

        if (count == 1) {
            var->setType(symbol->getReturnType());
        }
        else {
            ConstantRange range{1, int32_t(count)};
            var->setType(
                FixedSizeUnpackedArrayType::fromDim(scope, symbol->getReturnType(), range, syntax));
        }

        results.push_back(var);
    }
}